

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

int cloudDagSize(CloudManager *dd,CloudNode *n)

{
  int iVar1;
  int iVar2;
  int eval;
  int tval;
  CloudNode *n_local;
  CloudManager *dd_local;
  
  if ((n->v & 0x10000000) == 0) {
    n->v = n->v | 0x10000000;
    if ((n->v & 0xefffffff) == 0xfffffff) {
      dd_local._4_4_ = 1;
    }
    else {
      iVar1 = cloudDagSize(dd,n->t);
      iVar2 = cloudDagSize(dd,(CloudNode *)((ulong)n->e & 0xfffffffffffffffe));
      dd_local._4_4_ = iVar1 + iVar2 + 1;
    }
  }
  else {
    dd_local._4_4_ = 0;
  }
  return dd_local._4_4_;
}

Assistant:

static int cloudDagSize( CloudManager * dd, CloudNode * n )
{
	int tval, eval;
	if ( cloudNodeIsMarked(n) )
		return 0;
	// set visited flag
	cloudNodeMark(n);
	if ( cloudIsConstant(n) )
		return 1;
	tval = cloudDagSize( dd, cloudT(n) );
	eval = cloudDagSize( dd, Cloud_Regular(cloudE(n)) );
	return tval + eval + 1;

}